

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

void __thiscall
TestClass::SyncFunc10
          (TestClass *this,uint64_t *p1,uint32_t *p2,uint16_t *p3,uint8_t *p4,int64_t *p5,
          int32_t *p6,int16_t *p7,int8_t *p8,bool *p9,char *p10)

{
  SyncEventAgent *this_00;
  void *__buf;
  int __flags;
  
  __flags = (int)p4;
  this_00 = (SyncEventAgent *)
            operator_new(0x80,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0xdd);
  *(undefined8 *)&(this_00->super_EventAgent).super_Event.super_RefCount.mRefCount =
       0xfffffffb00000000;
  (this_00->super_EventAgent).super_Event.mPriority = 0;
  (this_00->super_EventAgent).super_Event.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR_onRefCountZero_001109a0;
  this_00[1].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)this;
  *(code **)&this_00[1].super_EventAgent.super_Event.super_RefCount.mRefCount = handleSyncFunc10;
  *(undefined8 *)&this_00[1].super_EventAgent.super_Event.mPriority = 0;
  this_00[2].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p1;
  *(uint32_t **)&this_00[2].super_EventAgent.super_Event.super_RefCount.mRefCount = p2;
  *(uint16_t **)&this_00[2].super_EventAgent.super_Event.mPriority = p3;
  this_00[3].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p4;
  *(int64_t **)&this_00[3].super_EventAgent.super_Event.super_RefCount.mRefCount = p5;
  *(int32_t **)&this_00[3].super_EventAgent.super_Event.mPriority = p6;
  this_00[4].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p7;
  *(int8_t **)&this_00[4].super_EventAgent.super_Event.super_RefCount.mRefCount = p8;
  *(bool **)&this_00[4].super_EventAgent.super_Event.mPriority = p9;
  this_00[5].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p10;
  SyncEventAgent::send(this_00,(int)this + 8,__buf,(size_t)p5,__flags);
  return;
}

Assistant:

void SyncFunc10(uint64_t &p1, uint32_t &p2, uint16_t &p3, uint8_t &p4,
				   int64_t &p5, int32_t &p6, int16_t &p7, int8_t &p8, bool &p9, char &p10)
	{
		SyncEventAgent10<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &, int16_t &, int8_t &, bool&, char&> *agent =
			jh_new SyncEventAgent10<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &, int16_t &, int8_t &, bool&, char&>(this, &TestClass::handleSyncFunc10,
			p1, p2, p3, p4, p5, p6, p7, p8, p9, p10);
		agent->send(&mEventThread);
		LOG_INFO("Sync10 result %llu, %u, %u, %u, %lld, %d, %d, %d, %d, %c", p1, p2, p3, p4, p5, p6, p7, p8, p9, p10);
	}